

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Bdc_Isf_t *pBVar9;
  Bdc_Isf_t *pIsfR_00;
  Bdc_Isf_t *pBVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  Bdc_Type_t BVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  Bdc_Fun_t *pBVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Bdc_Isf_t T;
  
  pBVar9 = p->pIsfOL;
  pBVar9->uSupp = 0;
  pBVar9->uUniq = 0;
  pIsfR_00 = p->pIsfOR;
  pIsfR_00->uSupp = 0;
  pIsfR_00->uUniq = 0;
  pBVar10 = p->pIsfAL;
  pBVar10->uSupp = 0;
  pBVar10->uUniq = 0;
  pBVar10 = p->pIsfAR;
  pBVar10->uSupp = 0;
  pBVar10->uUniq = 0;
  iVar18 = Bdc_DecomposeOr(p,pIsf,pBVar9,pIsfR_00);
  uVar1 = pIsf->puOn;
  uVar5 = pIsf->puOff;
  auVar25._8_4_ = (int)uVar1;
  auVar25._0_8_ = uVar5;
  auVar25._12_4_ = (int)((ulong)uVar1 >> 0x20);
  pIsf->puOn = (uint *)uVar5;
  pIsf->puOff = (uint *)auVar25._8_8_;
  iVar19 = Bdc_DecomposeOr(p,pIsf,p->pIsfAL,p->pIsfAR);
  uVar2 = pIsf->puOn;
  uVar6 = pIsf->puOff;
  auVar26._8_4_ = (int)uVar2;
  auVar26._0_8_ = uVar6;
  auVar26._12_4_ = (int)((ulong)uVar2 >> 0x20);
  pIsf->puOn = (uint *)uVar6;
  pIsf->puOff = (uint *)auVar26._8_8_;
  pBVar9 = p->pIsfAL;
  uVar3 = pBVar9->puOn;
  uVar7 = pBVar9->puOff;
  auVar27._8_4_ = (int)uVar3;
  auVar27._0_8_ = uVar7;
  auVar27._12_4_ = (int)((ulong)uVar3 >> 0x20);
  pBVar9->puOn = (uint *)uVar7;
  pBVar9->puOff = (uint *)auVar27._8_8_;
  pBVar9 = p->pIsfAR;
  uVar4 = pBVar9->puOn;
  uVar8 = pBVar9->puOff;
  auVar28._8_4_ = (int)uVar4;
  auVar28._0_8_ = uVar8;
  auVar28._12_4_ = (int)((ulong)uVar4 >> 0x20);
  pBVar9->puOn = (uint *)uVar8;
  pBVar9->puOff = (uint *)auVar28._8_8_;
  if (iVar18 == 0 && iVar19 == 0) {
    pBVar9 = p->pIsfOL;
    puVar11 = pIsfL->puOff;
    uVar16 = pIsfL->uSupp;
    uVar17 = pIsfL->uUniq;
    puVar12 = pIsfL->puOn;
    pIsfL->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfL->uSupp = pBVar9->uSupp;
    pIsfL->uUniq = uVar15;
    pIsfL->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    pBVar9 = p->pIsfOR;
    puVar11 = pIsfR->puOff;
    uVar16 = pIsfR->uSupp;
    uVar17 = pIsfR->uUniq;
    puVar12 = pIsfR->puOn;
    pIsfR->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfR->uSupp = pBVar9->uSupp;
    pIsfR->uUniq = uVar15;
    pIsfR->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    return BDC_TYPE_MUX;
  }
  if (iVar18 == 0 && iVar19 == 0) {
    __assert_fail("WeightOr || WeightAnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0x1d7,
                  "Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  bVar24 = false;
  bVar22 = false;
  bVar23 = false;
  bVar21 = false;
  if (iVar18 != 0) {
    bVar23 = false;
    if (p->pIsfOL->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfOL);
      pBVar20 = Bdc_TableLookup(p,p->pIsfOL);
      bVar22 = pBVar20 != (Bdc_Fun_t *)0x0;
    }
    bVar21 = bVar22;
    if (p->pIsfOR->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfOR);
      pBVar20 = Bdc_TableLookup(p,p->pIsfOR);
      bVar23 = pBVar20 != (Bdc_Fun_t *)0x0;
    }
  }
  bVar22 = false;
  if (iVar19 != 0) {
    bVar22 = false;
    bVar24 = false;
    if (p->pIsfAL->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfAL);
      pBVar20 = Bdc_TableLookup(p,p->pIsfAL);
      bVar24 = pBVar20 != (Bdc_Fun_t *)0x0;
    }
    if (p->pIsfAR->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfAR);
      pBVar20 = Bdc_TableLookup(p,p->pIsfAR);
      bVar22 = pBVar20 != (Bdc_Fun_t *)0x0;
    }
  }
  if ((byte)(bVar24 + bVar22) < (byte)(bVar23 + bVar21)) {
    p->numReuse = p->numReuse + 1;
LAB_004bec90:
    p->numOrs = p->numOrs + 1;
    pBVar9 = p->pIsfOL;
    puVar11 = pIsfL->puOff;
    uVar16 = pIsfL->uSupp;
    uVar17 = pIsfL->uUniq;
    puVar12 = pIsfL->puOn;
    pIsfL->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfL->uSupp = pBVar9->uSupp;
    pIsfL->uUniq = uVar15;
    pIsfL->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    pBVar9 = p->pIsfOR;
    puVar11 = pIsfR->puOff;
    uVar16 = pIsfR->uSupp;
    uVar17 = pIsfR->uUniq;
    puVar12 = pIsfR->puOn;
    pIsfR->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfR->uSupp = pBVar9->uSupp;
    pIsfR->uUniq = uVar15;
    pIsfR->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    BVar14 = BDC_TYPE_OR;
  }
  else {
    if ((byte)(bVar23 + bVar21) < (byte)(bVar24 + bVar22)) {
      p->numReuse = p->numReuse + 1;
    }
    else {
      if (iVar19 < iVar18) {
        if (iVar18 < 1000) {
          p->numWeaks = p->numWeaks + 1;
        }
        goto LAB_004bec90;
      }
      if (iVar19 < 1000) {
        p->numWeaks = p->numWeaks + 1;
      }
    }
    p->numAnds = p->numAnds + 1;
    pBVar9 = p->pIsfAL;
    puVar11 = pIsfL->puOff;
    uVar16 = pIsfL->uSupp;
    uVar17 = pIsfL->uUniq;
    puVar12 = pIsfL->puOn;
    pIsfL->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfL->uSupp = pBVar9->uSupp;
    pIsfL->uUniq = uVar15;
    pIsfL->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    pBVar9 = p->pIsfAR;
    puVar11 = pIsfR->puOff;
    uVar16 = pIsfR->uSupp;
    uVar17 = pIsfR->uUniq;
    puVar12 = pIsfR->puOn;
    pIsfR->puOff = pBVar9->puOff;
    uVar15 = pBVar9->uUniq;
    puVar13 = pBVar9->puOn;
    pIsfR->uSupp = pBVar9->uSupp;
    pIsfR->uUniq = uVar15;
    pIsfR->puOn = puVar13;
    pBVar9->puOff = puVar11;
    pBVar9->uSupp = uVar16;
    pBVar9->uUniq = uVar17;
    pBVar9->puOn = puVar12;
    BVar14 = BDC_TYPE_AND;
  }
  return BVar14;
}

Assistant:

Bdc_Type_t Bdc_DecomposeStep( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    int WeightOr, WeightAnd, WeightOrL, WeightOrR, WeightAndL, WeightAndR;

    Bdc_IsfClean( p->pIsfOL );
    Bdc_IsfClean( p->pIsfOR );
    Bdc_IsfClean( p->pIsfAL );
    Bdc_IsfClean( p->pIsfAR );

    // perform OR decomposition
    WeightOr = Bdc_DecomposeOr( p, pIsf, p->pIsfOL, p->pIsfOR );

    // perform AND decomposition
    Bdc_IsfNot( pIsf );
    WeightAnd = Bdc_DecomposeOr( p, pIsf, p->pIsfAL, p->pIsfAR );
    Bdc_IsfNot( pIsf );
    Bdc_IsfNot( p->pIsfAL );
    Bdc_IsfNot( p->pIsfAR );

    // check the case when decomposition does not exist
    if ( WeightOr == 0 && WeightAnd == 0 )
    {
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_MUX;
    }
    // check the hash table
    assert( WeightOr || WeightAnd );
    WeightOrL = WeightOrR = 0;
    if ( WeightOr )
    {
        if ( p->pIsfOL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOL );
            WeightOrL = (Bdc_TableLookup(p, p->pIsfOL) != NULL);
        }
        if ( p->pIsfOR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOR );
            WeightOrR = (Bdc_TableLookup(p, p->pIsfOR) != NULL);
        }
    }
    WeightAndL = WeightAndR = 0;
    if ( WeightAnd )
    {
        if ( p->pIsfAL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAL );
            WeightAndL = (Bdc_TableLookup(p, p->pIsfAL) != NULL);
        }
        if ( p->pIsfAR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAR );
            WeightAndR = (Bdc_TableLookup(p, p->pIsfAR) != NULL);
        }
    }

    // check if there is any reuse for the components
    if ( WeightOrL + WeightOrR > WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightOrL + WeightOrR < WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numAnds++;
        Bdc_IsfCopy( pIsfL, p->pIsfAL );
        Bdc_IsfCopy( pIsfR, p->pIsfAR );
        return BDC_TYPE_AND; 
    }

    // compare the two-component costs
    if ( WeightOr > WeightAnd )
    {
        if ( WeightOr < BDC_SCALE )
            p->numWeaks++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightAnd < BDC_SCALE )
        p->numWeaks++;
    p->numAnds++;
    Bdc_IsfCopy( pIsfL, p->pIsfAL );
    Bdc_IsfCopy( pIsfR, p->pIsfAR );
    return BDC_TYPE_AND;
}